

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void __thiscall Pathie::Path::split(Path *this,Path *dname,Path *bname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Path local_40;
  
  dirname(&local_40,(char *)this);
  if (&local_40 != dname) {
    std::__cxx11::string::_M_assign((string *)dname);
  }
  paVar1 = &local_40.m_path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.m_path._M_dataplus._M_p);
  }
  basename(&local_40,(char *)this);
  if (&local_40 != bname) {
    std::__cxx11::string::_M_assign((string *)bname);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.m_path._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Path::split(Path& dname, Path& bname) const
{
  dname = dirname();
  bname = basename();
}